

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMan.c
# Opt level: O2

Nwk_Man_t * Nwk_ManAlloc(void)

{
  Nwk_Man_t *pNVar1;
  Vec_Ptr_t *pVVar2;
  Aig_MmFlex_t *pAVar3;
  Hop_Man_t *pHVar4;
  int nCap;
  
  nCap = 1;
  pNVar1 = (Nwk_Man_t *)calloc(1,0x80);
  pVVar2 = Vec_PtrAlloc(nCap);
  pNVar1->vCis = pVVar2;
  pVVar2 = Vec_PtrAlloc(nCap);
  pNVar1->vCos = pVVar2;
  pVVar2 = Vec_PtrAlloc(nCap);
  pNVar1->vObjs = pVVar2;
  pVVar2 = Vec_PtrAlloc(nCap);
  pNVar1->vTemp = pVVar2;
  pNVar1->nFanioPlus = 2;
  pAVar3 = Aig_MmFlexStart();
  pNVar1->pMemObjs = pAVar3;
  pHVar4 = Hop_ManStart();
  pNVar1->pManHop = pHVar4;
  return pNVar1;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Allocates the manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Nwk_Man_t * Nwk_ManAlloc()
{
    Nwk_Man_t * p;
    p = ABC_ALLOC( Nwk_Man_t, 1 );
    memset( p, 0, sizeof(Nwk_Man_t) );
    p->vCis = Vec_PtrAlloc( 1000 );
    p->vCos = Vec_PtrAlloc( 1000 );
    p->vObjs = Vec_PtrAlloc( 1000 );
    p->vTemp = Vec_PtrAlloc( 1000 );
    p->nFanioPlus = 2;
    p->pMemObjs = Aig_MmFlexStart();
    p->pManHop = Hop_ManStart();
    return p;
}